

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall llbuild::core::Rule::~Rule(Rule *this)

{
  Rule *this_local;
  
  this->_vptr_Rule = (_func_int **)&PTR___cxa_pure_virtual_00378b30;
  KeyType::~KeyType(&this->key);
  return;
}

Assistant:

Rule::~Rule() {}